

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  int recomputeRHS;
  ARKodeERKStepMem step_mem;
  int retval;
  ARKodeERKStepMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  
  iVar1 = erkStep_AccessStepMem
                    (in_stack_ffffffffffffffc8,
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (in_ECX == 0) {
    if (in_RDI->fn_is_current == 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc8->sunctx)
                        (in_XMM0_Qa,in_RSI,*(undefined8 *)in_stack_ffffffffffffffc8->uround,
                         in_RDI->user_data);
      in_stack_ffffffffffffffc8->Sabstol =
           (sunrealtype)((long)in_stack_ffffffffffffffc8->Sabstol + 1);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x20d,"erkStep_FullRHS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                        ,
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    N_VScale(0x3ff0000000000000,*(undefined8 *)in_stack_ffffffffffffffc8->uround,in_RDX);
  }
  else if (in_ECX == 1) {
    if (in_RDI->fn_is_current == 0) {
      iVar1 = ARKodeButcherTable_IsStifflyAccurate
                        ((ARKodeButcherTable)in_stack_ffffffffffffffc8->reltol);
      if (in_RDI->relax_enabled == 0 && iVar1 != 0) {
        N_VScale(0x3ff0000000000000,
                 *(undefined8 *)
                  ((long)in_stack_ffffffffffffffc8->uround +
                  (long)(in_stack_ffffffffffffffc8->itol + -1) * 8),
                 *(undefined8 *)in_stack_ffffffffffffffc8->uround);
      }
      else {
        iVar1 = (*(code *)in_stack_ffffffffffffffc8->sunctx)
                          (in_XMM0_Qa,in_RSI,*(undefined8 *)in_stack_ffffffffffffffc8->uround,
                           in_RDI->user_data);
        in_stack_ffffffffffffffc8->Sabstol =
             (sunrealtype)((long)in_stack_ffffffffffffffc8->Sabstol + 1);
        if (iVar1 != 0) {
          arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x22a,"erkStep_FullRHS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                          ,
                          "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                         );
          return -8;
        }
      }
    }
    N_VScale(0x3ff0000000000000,*(undefined8 *)in_stack_ffffffffffffffc8->uround,in_RDX);
  }
  else {
    if (in_ECX != 2) {
      arkProcessError(in_RDI,-8,0x247,"erkStep_FullRHS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                      ,"Unknown full RHS mode");
      return -8;
    }
    iVar1 = (*(code *)in_stack_ffffffffffffffc8->sunctx)(in_XMM0_Qa,in_RSI,in_RDX,in_RDI->user_data)
    ;
    in_stack_ffffffffffffffc8->Sabstol = (sunrealtype)((long)in_stack_ffffffffffffffc8->Sabstol + 1)
    ;
    if (iVar1 != 0) {
      arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x23e,"erkStep_FullRHS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                      ,"At t = %lg, the right-hand side routine failed in an unrecoverable manner.")
      ;
      return -8;
    }
  }
  return 0;
}

Assistant:

int erkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                    int mode)
{
  int retval;
  ARKodeERKStepMem step_mem;
  sunbooleantype recomputeRHS;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* compute the RHS */
    if (!(ark_mem->fn_is_current))
    {
      retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return (ARK_RHSFUNC_FAIL);
      }
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;

  case ARK_FULLRHS_END:

    /* determine if RHS function needs to be recomputed */
    if (!(ark_mem->fn_is_current))
    {
      recomputeRHS = !ARKodeButcherTable_IsStifflyAccurate(step_mem->B);

      /* First Same As Last methods are not FSAL when relaxation is enabled */
      if (ark_mem->relax_enabled) { recomputeRHS = SUNTRUE; }

      /* base RHS calls on recomputeRHS argument */
      if (recomputeRHS)
      {
        /* call f */
        retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
        step_mem->nfe++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
      }
      else { N_VScale(ONE, step_mem->F[step_mem->stages - 1], step_mem->F[0]); }
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;

  case ARK_FULLRHS_OTHER:

    /* call f */
    retval = step_mem->f(t, y, f, ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}